

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

int qp_lookahead_eol(mime_encoder_state *st,int ateof,size_t n)

{
  ulong uVar1;
  size_t n_local;
  int ateof_local;
  mime_encoder_state *st_local;
  
  uVar1 = st->bufbeg + n;
  if ((uVar1 < st->bufend) || (ateof == 0)) {
    if (st->bufend < uVar1 + 2) {
      st_local._4_4_ = -1;
      if (ateof != 0) {
        st_local._4_4_ = 0;
      }
    }
    else if ((""[(int)(uint)(byte)st->buf[uVar1]] == '\x03') &&
            (""[(int)(uint)(byte)st->buf[uVar1 + 1]] == '\x04')) {
      st_local._4_4_ = 1;
    }
    else {
      st_local._4_4_ = 0;
    }
  }
  else {
    st_local._4_4_ = 1;
  }
  return st_local._4_4_;
}

Assistant:

static int qp_lookahead_eol(struct mime_encoder_state *st, int ateof, size_t n)
{
  n += st->bufbeg;
  if(n >= st->bufend && ateof)
    return 1;
  if(n + 2 > st->bufend)
    return ateof ? 0 : -1;
  if(qp_class[st->buf[n] & 0xFF] == QP_CR &&
     qp_class[st->buf[n + 1] & 0xFF] == QP_LF)
    return 1;
  return 0;
}